

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void tcmalloc::AddToFreelist(void *v,Arena *arena)

{
  long lVar1;
  int iVar2;
  AllocList *e;
  intptr_t iVar3;
  AllocList *local_118;
  AllocList *prev [30];
  AllocList *f;
  Arena *arena_local;
  void *v_local;
  
  e = (AllocList *)((long)v + -0x20);
  lVar1 = *(long *)((long)v + -0x18);
  iVar3 = Magic(0x4c833e95,(Header *)e);
  if (lVar1 != iVar3) {
    syscall(1,2,
            "Check failed: f->header.magic == Magic(kMagicAllocated, &f->header): bad magic number in AddToFreelist()\n"
            ,0x69);
    abort();
  }
  if (*(Arena **)((long)v + -0x10) != arena) {
    syscall(1,2,"Check failed: f->header.arena == arena: bad arena pointer in AddToFreelist()\n",
            0x4d);
    abort();
  }
  iVar2 = LLA_SkiplistLevels((e->header).size,arena->min_size,true);
  *(int *)v = iVar2;
  LLA_SkiplistInsert(&arena->freelist,e,&local_118);
  iVar3 = Magic(-0x4c833e96,(Header *)e);
  *(intptr_t *)((long)v + -0x18) = iVar3;
  Coalesce(e);
  Coalesce(local_118);
  return;
}

Assistant:

static void AddToFreelist(void *v, LowLevelAlloc::Arena *arena) {
  AllocList *f = reinterpret_cast<AllocList *>(
                        reinterpret_cast<char *>(v) - sizeof (f->header));
  RAW_CHECK(f->header.magic == Magic(kMagicAllocated, &f->header),
            "bad magic number in AddToFreelist()");
  RAW_CHECK(f->header.arena == arena,
            "bad arena pointer in AddToFreelist()");
  f->levels = LLA_SkiplistLevels(f->header.size, arena->min_size, true);
  AllocList *prev[kMaxLevel];
  LLA_SkiplistInsert(&arena->freelist, f, prev);
  f->header.magic = Magic(kMagicUnallocated, &f->header);
  Coalesce(f);                  // maybe coalesce with successor
  Coalesce(prev[0]);            // maybe coalesce with predecessor
}